

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O2

int xmlParserInputBufferPush(xmlParserInputBufferPtr in,int len,char *buf)

{
  int iVar1;
  xmlBufPtr buf_00;
  ulong uVar2;
  size_t local_28;
  
  if (len < 0) {
    return 0;
  }
  if (in == (xmlParserInputBufferPtr)0x0) {
    return -1;
  }
  if (in->error != 0) {
    return -1;
  }
  if (in->encoder == (xmlCharEncodingHandlerPtr)0x0) {
    iVar1 = xmlBufAdd(in->buffer,(xmlChar *)buf,(ulong)(uint)len);
    if (iVar1 == 0) {
      return len;
    }
  }
  else {
    buf_00 = in->raw;
    if (buf_00 == (xmlBufPtr)0x0) {
      buf_00 = xmlBufCreate(0x32);
      in->raw = buf_00;
      if (buf_00 == (xmlBufPtr)0x0) goto LAB_0015a58c;
    }
    iVar1 = xmlBufAdd(buf_00,(xmlChar *)buf,(ulong)(uint)len);
    if (iVar1 == 0) {
      local_28 = 0xffffffffffffffff;
      iVar1 = xmlCharEncInput(in,&local_28);
      if (iVar1 < 0) {
        return -1;
      }
      uVar2 = 0x7fffffff;
      if (local_28 < 0x7fffffff) {
        uVar2 = local_28;
      }
      return (int)uVar2;
    }
  }
LAB_0015a58c:
  in->error = 2;
  return -1;
}

Assistant:

int
xmlParserInputBufferPush(xmlParserInputBufferPtr in,
	                 int len, const char *buf) {
    size_t nbchars = 0;
    int ret;

    if (len < 0) return(0);
    if ((in == NULL) || (in->error)) return(-1);
    if (in->encoder != NULL) {
        /*
	 * Store the data in the incoming raw buffer
	 */
        if (in->raw == NULL) {
	    in->raw = xmlBufCreate(50);
            if (in->raw == NULL) {
                in->error = XML_ERR_NO_MEMORY;
                return(-1);
            }
	}
	ret = xmlBufAdd(in->raw, (const xmlChar *) buf, len);
	if (ret != 0) {
            in->error = XML_ERR_NO_MEMORY;
	    return(-1);
        }

	/*
	 * convert as much as possible to the parser reading buffer.
	 */
        nbchars = SIZE_MAX;
	if (xmlCharEncInput(in, &nbchars) < 0)
            return(-1);
        if (nbchars > INT_MAX)
            nbchars = INT_MAX;
    } else {
	nbchars = len;
        ret = xmlBufAdd(in->buffer, (xmlChar *) buf, nbchars);
	if (ret != 0) {
            in->error = XML_ERR_NO_MEMORY;
	    return(-1);
        }
    }
    return(nbchars);
}